

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall
pbrt::ParsedScene::AreaLightSource
          (ParsedScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  GraphicsState *pGVar1;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  ParameterDictionary local_e8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_80;
  
  if (this->currentApiState == OptionsBlock) {
    local_e8.params.alloc.memoryResource = (memory_resource *)&local_e8.params.field_2;
    local_e8.params.ptr = (ParsedParameter **)0x0;
    local_e8.params.field_2._0_1_ = 0;
    detail::stringPrintfRecursive<char_const(&)[16]>
              ((string *)&local_e8,
               "Scene description must be inside world block; \"%s\" not allowed. Ignoring.",
               (char (*) [16])"AreaLightSource");
    Error((FileLoc *)&params,(char *)local_e8.params.alloc.memoryResource);
  }
  else {
    if (this->currentApiState != Uninitialized) {
      std::__cxx11::string::_M_assign((string *)&this->graphicsState->areaLightName);
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::InlinedVector(&local_80,in_RDX);
      ParameterDictionary::ParameterDictionary
                (&local_e8,&local_80,&this->graphicsState->lightAttributes,
                 this->graphicsState->colorSpace);
      pGVar1 = this->graphicsState;
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::operator=(&(pGVar1->areaLightParams).params,&local_e8.params);
      (pGVar1->areaLightParams).colorSpace = local_e8.colorSpace;
      local_e8.params.nStored = 0;
      (*(local_e8.params.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_e8.params.alloc.memoryResource,local_e8.params.ptr,
                 local_e8.params.nAlloc << 3,8);
      local_80.nStored = 0;
      (*(local_80.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_80.alloc.memoryResource,local_80.ptr,local_80.nAlloc << 3,8);
      pGVar1 = this->graphicsState;
      *(ParsedParameter **)&(pGVar1->areaLightLoc).line = params.field_2.fixed[0];
      (pGVar1->areaLightLoc).filename._M_len = (size_t)params.alloc.memoryResource;
      (pGVar1->areaLightLoc).filename._M_str = (char *)params.ptr;
      return;
    }
    local_e8.params.alloc.memoryResource = (memory_resource *)&local_e8.params.field_2;
    local_e8.params.ptr = (ParsedParameter **)0x0;
    local_e8.params.field_2._0_1_ = 0;
    detail::stringPrintfRecursive<char_const(&)[16]>
              ((string *)&local_e8,"pbrtInit() must be before calling \"%s()\". Ignoring.",
               (char (*) [16])"AreaLightSource");
    Error((FileLoc *)&params,(char *)local_e8.params.alloc.memoryResource);
  }
  if ((anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
       *)local_e8.params.alloc.memoryResource != &local_e8.params.field_2) {
    operator_delete(local_e8.params.alloc.memoryResource,
                    CONCAT71(local_e8.params.field_2._1_7_,local_e8.params.field_2._0_1_) + 1);
  }
  return;
}

Assistant:

void ParsedScene::AreaLightSource(const std::string &name, ParsedParameterVector params,
                                  FileLoc loc) {
    VERIFY_WORLD("AreaLightSource");
    graphicsState->areaLightName = name;
    graphicsState->areaLightParams = ParameterDictionary(
        std::move(params), graphicsState->lightAttributes, graphicsState->colorSpace);
    graphicsState->areaLightLoc = loc;
}